

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::NeuralNetworkShaper
          (NeuralNetworkShaper *this,ModelDescription *interface,
          RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers,
          bool useInputAndOutputConstraints)

{
  value_type_conflict2 vVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  TypeCase TVar5;
  ImageFeatureType_ColorSpace IVar6;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar7;
  FeatureDescription *this_00;
  string *psVar8;
  mapped_type *pmVar9;
  mapped_type *this_01;
  FeatureType *pFVar10;
  ImageFeatureType *pIVar11;
  size_t sVar12;
  ArrayFeatureType *pAVar13;
  ShapeConstraint *constraint_1;
  _Self local_c8;
  FeatureDescription *local_c0;
  FeatureDescription *desc_1;
  int i_3;
  NeuralNetworkLayer *layer_1;
  NeuralNetworkLayer *pNStack_a0;
  int i_2;
  NeuralNetworkLayer *layer;
  undefined1 local_90 [4];
  int i_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  blobColorsCopy;
  bool done;
  ShapeConstraint *constraint;
  FeatureDescription *desc;
  value_type_conflict2 local_28;
  byte local_21;
  int i;
  bool useInputAndOutputConstraints_local;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *layers_local;
  ModelDescription *interface_local;
  NeuralNetworkShaper *this_local;
  
  local_21 = useInputAndOutputConstraints;
  _i = layers;
  layers_local = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)interface;
  interface_local = (ModelDescription *)this;
  pRVar7 = Specification::ModelDescription::input(interface);
  iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                    (pRVar7);
  this->numColors = iVar3;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map(&this->blobColors);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  ::map(&this->blobShapes);
  local_28 = 0;
  while( true ) {
    vVar1 = local_28;
    pRVar7 = Specification::ModelDescription::input((ModelDescription *)layers_local);
    iVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                      (pRVar7);
    if (iVar3 <= vVar1) break;
    this_00 = Specification::ModelDescription::input((ModelDescription *)layers_local,local_28);
    psVar8 = Specification::FeatureDescription::name_abi_cxx11_(this_00);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](&this->blobShapes,psVar8);
    psVar8 = Specification::FeatureDescription::name_abi_cxx11_(this_00);
    ShapeConstraint::setName(pmVar9,psVar8);
    psVar8 = Specification::FeatureDescription::name_abi_cxx11_(this_00);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              ::operator[](&this->blobColors,psVar8);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert(this_01,&local_28);
    if ((local_21 & 1) != 0) {
      pFVar10 = Specification::FeatureDescription::type(this_00);
      ShapeConstraint::updateConstraint(pmVar9,pFVar10);
    }
    local_28 = local_28 + 1;
  }
  blobColorsCopy._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  do {
    if (((blobColorsCopy._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ ^ 0xff) & 1) == 0)
    break;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           *)local_90,&this->blobColors);
    for (layer._4_4_ = 0; iVar3 = layer._4_4_,
        iVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::size
                          (_i), iVar3 < iVar4; layer._4_4_ = layer._4_4_ + 1) {
      pNStack_a0 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
                   operator[](_i,layer._4_4_);
      PassColorsDown(this,pNStack_a0);
      ProcessLayer(this,pNStack_a0);
    }
    layer_1._4_4_ =
         google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::size(_i);
    while (layer_1._4_4_ = layer_1._4_4_ + -1, -1 < layer_1._4_4_) {
      _i_3 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::
             operator[](_i,layer_1._4_4_);
      PassColorsUp(this,_i_3);
      ProcessLayer(this,_i_3);
    }
    blobColorsCopy._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = AllShapesDone(this);
    bVar2 = std::operator==((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                             *)local_90,&this->blobColors);
    if (bVar2) {
      desc_1._4_4_ = 6;
    }
    else {
      desc_1._4_4_ = 0;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            *)local_90);
  } while (desc_1._4_4_ == 0);
  if ((local_21 & 1) != 0) {
    desc_1._0_4_ = 0;
    while( true ) {
      iVar3 = (int)desc_1;
      pRVar7 = Specification::ModelDescription::output((ModelDescription *)layers_local);
      iVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::size
                        (pRVar7);
      if (iVar4 <= iVar3) break;
      local_c0 = Specification::ModelDescription::output
                           ((ModelDescription *)layers_local,(int)desc_1);
      psVar8 = Specification::FeatureDescription::name_abi_cxx11_(local_c0);
      Specification::ModelDescription::predictedprobabilitiesname_abi_cxx11_
                ((ModelDescription *)layers_local);
      iVar3 = std::__cxx11::string::compare((string *)psVar8);
      if (iVar3 != 0) {
        psVar8 = Specification::FeatureDescription::name_abi_cxx11_(local_c0);
        Specification::ModelDescription::predictedfeaturename_abi_cxx11_
                  ((ModelDescription *)layers_local);
        iVar3 = std::__cxx11::string::compare((string *)psVar8);
        if (iVar3 != 0) {
          psVar8 = Specification::FeatureDescription::name_abi_cxx11_(local_c0);
          local_c8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::find(&this->blobShapes,psVar8);
          constraint_1 = (ShapeConstraint *)
                         std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                         ::end(&this->blobShapes);
          bVar2 = std::operator==(&local_c8,(_Self *)&constraint_1);
          if (!bVar2) {
            psVar8 = Specification::FeatureDescription::name_abi_cxx11_(local_c0);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                     ::at(&this->blobShapes,psVar8);
            pFVar10 = Specification::FeatureDescription::type(local_c0);
            TVar5 = Specification::FeatureType::Type_case(pFVar10);
            if (TVar5 == kImageType) {
              pFVar10 = Specification::FeatureDescription::type(local_c0);
              pIVar11 = Specification::FeatureType::imagetype(pFVar10);
              IVar6 = Specification::ImageFeatureType::colorspace(pIVar11);
              if (IVar6 == ImageFeatureType_ColorSpace_GRAYSCALE) {
                ShapeConstraint::setChannel(pmVar9,1);
              }
              else {
                ShapeConstraint::setChannel(pmVar9,3);
              }
              pFVar10 = Specification::FeatureDescription::type(local_c0);
              pIVar11 = Specification::FeatureType::imagetype(pFVar10);
              sVar12 = Specification::ImageFeatureType::height(pIVar11);
              ShapeConstraint::setHeight(pmVar9,sVar12);
              pFVar10 = Specification::FeatureDescription::type(local_c0);
              pIVar11 = Specification::FeatureType::imagetype(pFVar10);
              sVar12 = Specification::ImageFeatureType::width(pIVar11);
              ShapeConstraint::setWidth(pmVar9,sVar12);
            }
            else {
              pFVar10 = Specification::FeatureDescription::type(local_c0);
              pAVar13 = Specification::FeatureType::multiarraytype(pFVar10);
              iVar3 = Specification::ArrayFeatureType::shape_size(pAVar13);
              if (iVar3 == 3) {
                pFVar10 = Specification::FeatureDescription::type(local_c0);
                pAVar13 = Specification::FeatureType::multiarraytype(pFVar10);
                sVar12 = Specification::ArrayFeatureType::shape(pAVar13,0);
                ShapeConstraint::setChannel(pmVar9,sVar12);
                pFVar10 = Specification::FeatureDescription::type(local_c0);
                pAVar13 = Specification::FeatureType::multiarraytype(pFVar10);
                sVar12 = Specification::ArrayFeatureType::shape(pAVar13,1);
                ShapeConstraint::setHeight(pmVar9,sVar12);
                pFVar10 = Specification::FeatureDescription::type(local_c0);
                pAVar13 = Specification::FeatureType::multiarraytype(pFVar10);
                sVar12 = Specification::ArrayFeatureType::shape(pAVar13,2);
                ShapeConstraint::setWidth(pmVar9,sVar12);
              }
              else {
                pFVar10 = Specification::FeatureDescription::type(local_c0);
                pAVar13 = Specification::FeatureType::multiarraytype(pFVar10);
                iVar3 = Specification::ArrayFeatureType::shape_size(pAVar13);
                if (iVar3 == 1) {
                  pFVar10 = Specification::FeatureDescription::type(local_c0);
                  pAVar13 = Specification::FeatureType::multiarraytype(pFVar10);
                  sVar12 = Specification::ArrayFeatureType::shape(pAVar13,0);
                  ShapeConstraint::setChannel(pmVar9,sVar12);
                  ShapeConstraint::setHeight(pmVar9,1);
                  ShapeConstraint::setWidth(pmVar9,1);
                }
              }
            }
          }
        }
      }
      desc_1._0_4_ = (int)desc_1 + 1;
    }
  }
  return;
}

Assistant:

NeuralNetworkShaper::NeuralNetworkShaper(const Specification::ModelDescription& interface, const google::protobuf::RepeatedPtrField<Specification::NeuralNetworkLayer>& layers, bool useInputAndOutputConstraints)
    :
    numColors(interface.input().size())
{

    for (int i = 0; i < interface.input().size(); i++) {
        const Specification::FeatureDescription& desc = interface.input(i);

        ShapeConstraint& constraint = blobShapes[desc.name()];
        constraint.setName(desc.name());
        // Each input blob starts as it's own color
        blobColors[desc.name()].insert(i);

        if (useInputAndOutputConstraints) {
            constraint.updateConstraint(desc.type());
        }

    }

    bool done = false;

    while (!done) {

        std::map<std::string, std::set<int> > blobColorsCopy = blobColors;

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << "=====================" << std::endl << "Computing neural network shapes" << std::endl  << "=====================" << std::endl;
        std::cout << std::endl << "Starting forward computation of neural network shapes" << std::endl << std::endl;
#endif

        // forward pass
        for (int i = 0; i < layers.size(); i++){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsDown(layer);
            ProcessLayer(layer);
        } // loop over layers

#if COREML_VALIDATOR_VERBOSE
        std::cout << std::endl << std::endl << "Starting backward computation of neural network shapes" << std::endl << std::endl;
#endif

        // backward pass
        for (int i = layers.size() - 1; i >= 0; i--){
            const Specification::NeuralNetworkLayer& layer = layers[i];
            PassColorsUp(layer);
            ProcessLayer(layer);
        } // loop over layers

        done = AllShapesDone();

        if (blobColorsCopy == blobColors) {
            break;
        }
    }

    if (useInputAndOutputConstraints) {
        for (int i = 0; i < interface.output().size(); i++) {
            const Specification::FeatureDescription& desc = interface.output(i);

            // skip over names that are just for the classifier
            if (desc.name().compare(interface.predictedprobabilitiesname()) == 0
                || desc.name().compare(interface.predictedfeaturename()) == 0) {
                continue;
            }
            
            // using at because it needs to exist, this will throw if it doesn't
            if (blobShapes.find(desc.name()) == blobShapes.end()) {
                continue;
            }
            ShapeConstraint& constraint = blobShapes.at(desc.name());

            // TODO: add a catch with an error message that mentions the name

            if (desc.type().Type_case() == Specification::FeatureType::kImageType) {
                // sequence constraint here is unbounded
                // batch is unbounded
                // other three read from the constraint as is -- later to be updated with flexibility
                if (desc.type().imagetype().colorspace() == Specification::ImageFeatureType_ColorSpace_GRAYSCALE)
                    constraint.setChannel(1);
                else {
                    constraint.setChannel(3);
                }
                constraint.setHeight(static_cast<size_t>(desc.type().imagetype().height()));
                constraint.setWidth(static_cast<size_t>(desc.type().imagetype().width()));
            }
            else { // assuming it's a multi array

                // allowing for the possibility that output shapes aren't constrained
                if (desc.type().multiarraytype().shape_size() == 3) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(static_cast<size_t>(desc.type().multiarraytype().shape(1)));
                    constraint.setWidth(static_cast<size_t>(desc.type().multiarraytype().shape(2)));
                }
                else if (desc.type().multiarraytype().shape_size() == 1) {
                    constraint.setChannel(static_cast<size_t>(desc.type().multiarraytype().shape(0)));
                    constraint.setHeight(1);
                    constraint.setWidth(1);
                }
            }
        }
    }

}